

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::BerdyHelper::serializeSensorVariables
          (BerdyHelper *this,SensorsMeasurements *sensMeas,LinkNetExternalWrenches *netExtWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,
          LinkInternalWrenches *linkJointWrenches,SpatialForceVector *rcm,VectorDynSize *y)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  undefined1 uVar5;
  Index index;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  pointer plVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  Index size;
  uint uVar17;
  IndexRange IVar18;
  Matrix<double,_6,_1,_0,_6,_1> ret_1;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  Wrench local_f8;
  undefined8 local_98 [4];
  undefined8 uStack_78;
  undefined8 local_70;
  Transform local_68 [8];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar5 = iDynTree::SensorsMeasurements::toVector((VectorDynSize *)sensMeas);
  uVar6 = iDynTree::VectorDynSize::size();
  lVar7 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uVar8 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uVar9 = uVar6;
  if (((uVar8 & 7) == 0) && (uVar9 = (ulong)((uint)(uVar8 >> 3) & 1), (long)uVar6 <= (long)uVar9)) {
    uVar9 = uVar6;
  }
  lVar13 = uVar6 - uVar9;
  if (0 < (long)uVar9) {
    uVar16 = 0;
    do {
      *(undefined8 *)(uVar8 + uVar16 * 8) = *(undefined8 *)(lVar7 + uVar16 * 8);
      uVar16 = uVar16 + 1;
    } while (uVar9 != uVar16);
  }
  uVar16 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
  if (1 < lVar13) {
    do {
      puVar10 = (undefined8 *)(lVar7 + uVar9 * 8);
      uVar3 = puVar10[1];
      puVar2 = (undefined8 *)(uVar8 + uVar9 * 8);
      *puVar2 = *puVar10;
      puVar2[1] = uVar3;
      uVar9 = uVar9 + 2;
    } while ((long)uVar9 < (long)uVar16);
  }
  if ((long)uVar16 < (long)uVar6) {
    do {
      *(undefined8 *)(uVar8 + uVar16 * 8) = *(undefined8 *)(lVar7 + uVar16 * 8);
      uVar16 = uVar16 + 1;
    } while (uVar6 != uVar16);
  }
  if ((this->m_options).includeAllJointAccelerationsAsSensors == true) {
    lVar7 = iDynTree::Model::getNrOfDOFs();
    if (0 < lVar7) {
      uVar9 = 0;
      do {
        IVar18 = getRangeDOFSensorVariable(this,DOF_ACCELERATION_SENSOR,uVar9);
        puVar10 = (undefined8 *)
                  iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,uVar9);
        uVar3 = *puVar10;
        puVar10 = (undefined8 *)iDynTree::VectorDynSize::operator()(y,IVar18.offset);
        *puVar10 = uVar3;
        uVar9 = uVar9 + 1;
        lVar7 = iDynTree::Model::getNrOfDOFs();
      } while ((long)uVar9 < lVar7);
    }
  }
  if ((this->m_options).includeAllJointTorquesAsSensors == true) {
    lVar7 = iDynTree::Model::getNrOfDOFs();
    if (0 < lVar7) {
      uVar9 = 0;
      do {
        IVar18 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,uVar9);
        puVar10 = (undefined8 *)
                  iDynTree::VectorDynSize::operator()((VectorDynSize *)jointTorques,uVar9);
        uVar3 = *puVar10;
        puVar10 = (undefined8 *)iDynTree::VectorDynSize::operator()(y,IVar18.offset);
        *puVar10 = uVar3;
        uVar9 = uVar9 + 1;
        lVar7 = iDynTree::Model::getNrOfDOFs();
      } while ((long)uVar9 < lVar7);
    }
  }
  if ((this->m_options).includeAllNetExternalWrenchesAsSensors == true) {
    lVar7 = iDynTree::Model::getNrOfLinks();
    if (0 < lVar7) {
      lVar7 = 0;
      do {
        if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
          iDynTree::Traversal::getBaseLink();
          lVar13 = iDynTree::Link::getIndex();
          if ((lVar7 != lVar13) || ((this->m_options).includeFixedBaseExternalWrench == true))
          goto LAB_001367ae;
        }
        else {
LAB_001367ae:
          IVar18 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar7);
          lVar13 = IVar18.offset;
          iDynTree::Transform::inverse();
          iDynTree::LinkWrenches::operator()(netExtWrenches,lVar7);
          iDynTree::Transform::operator*(local_68,&local_f8);
          local_98[0] = local_60;
          local_98[1] = uStack_58;
          local_98[2] = local_50;
          local_98[3] = local_48;
          uStack_78 = uStack_40;
          local_70 = local_38;
          lVar11 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pvVar1 = (void *)(lVar11 + lVar13 * 8);
          if (((ulong)pvVar1 & 7) == 0) {
            uVar9 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1);
          }
          else {
            uVar9 = 6;
          }
          iVar15 = (int)uVar9;
          if (uVar9 != 0) {
            memcpy(pvVar1,local_98,(ulong)(uint)(iVar15 * 8));
          }
          uVar17 = 6U - iVar15 & 0xfffffffe;
          uVar6 = uVar17 + uVar9;
          if (((ulong)pvVar1 & 7) == 0) {
            uVar8 = uVar9 + 2;
            if (uVar9 + 2 < uVar6) {
              uVar8 = uVar6;
            }
            memcpy((void *)(lVar11 + (lVar13 + uVar9) * 8),local_98 + uVar9,
                   (~uVar9 + uVar8 & 0xfffffffffffffffe) * 8 + 0x10);
          }
          if ((uint)uVar6 < 6) {
            uVar14 = 6U - iVar15 & 0xfffffffe;
            memcpy((void *)(lVar11 + (lVar13 + uVar9 + (ulong)uVar14) * 8),
                   local_98 + (uVar14 + iVar15),0x30 - (ulong)((uVar17 + iVar15) * 8));
          }
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
        }
        lVar7 = lVar7 + 1;
        lVar13 = iDynTree::Model::getNrOfLinks();
      } while (lVar7 < lVar13);
    }
  }
  plVar12 = (this->berdySensorsInfo).wrenchSensors.super__Vector_base<long,_std::allocator<long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->berdySensorsInfo).wrenchSensors.super__Vector_base<long,_std::allocator<long>_>._M_impl
      .super__Vector_impl_data._M_finish != plVar12) {
    uVar9 = 0;
    do {
      lVar7 = plVar12[uVar9];
      iDynTree::IndexRange::InvalidRange();
      uVar4 = (this->berdySensorsInfo).jntIdxToOffset.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      lVar7 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                        ((Model *)&this->m_dynamicsTraversal,(long)this);
      lVar7 = iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar7);
      local_f8._0_8_ = *(undefined8 *)(lVar7 + 8);
      local_f8._8_8_ = *(undefined8 *)(lVar7 + 0x10);
      local_f8._16_8_ = *(undefined8 *)(lVar7 + 0x18);
      local_f8._24_8_ = *(undefined8 *)(lVar7 + 0x20);
      local_f8._32_8_ = *(undefined8 *)(lVar7 + 0x28);
      local_f8._40_8_ = *(undefined8 *)(lVar7 + 0x30);
      lVar7 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      pvVar1 = (void *)(lVar7 + uVar4 * 8);
      if (((ulong)pvVar1 & 7) == 0) {
        uVar6 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1);
      }
      else {
        uVar6 = 6;
      }
      iVar15 = (int)uVar6;
      if (uVar6 != 0) {
        memcpy(pvVar1,&local_f8,(ulong)(uint)(iVar15 * 8));
      }
      uVar17 = 6U - iVar15 & 0xfffffffe;
      uVar8 = uVar17 + uVar6;
      if (((ulong)pvVar1 & 7) == 0) {
        uVar16 = uVar6 + 2;
        if (uVar6 + 2 < uVar8) {
          uVar16 = uVar8;
        }
        memcpy((void *)(lVar7 + (uVar4 + uVar6) * 8),&local_f8.super_SpatialForceVector + uVar6 * 8,
               (~uVar6 + uVar16 & 0xfffffffffffffffe) * 8 + 0x10);
      }
      if ((uint)uVar8 < 6) {
        lVar13 = (6U - iVar15 & 0xfffffffe) + uVar6;
        memcpy((void *)(lVar7 + (uVar4 + lVar13) * 8),
               &local_f8.super_SpatialForceVector + lVar13 * 8,0x30 - (ulong)((iVar15 + uVar17) * 8)
              );
      }
      uVar9 = uVar9 + 1;
      plVar12 = (this->berdySensorsInfo).wrenchSensors.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar9 < (ulong)((long)(this->berdySensorsInfo).wrenchSensors.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)plVar12 >> 3));
  }
  if ((this->m_options).berdyVariant == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    IVar18 = getRangeRCMSensorVariable(this,RCM_SENSOR);
    lVar7 = IVar18.offset;
    local_f8._0_8_ = *(undefined8 *)(rcm + 8);
    local_f8._8_8_ = *(undefined8 *)(rcm + 0x10);
    local_f8._16_8_ = *(undefined8 *)(rcm + 0x18);
    local_f8._24_8_ = *(undefined8 *)(rcm + 0x20);
    local_f8._32_8_ = *(undefined8 *)(rcm + 0x28);
    local_f8._40_8_ = *(undefined8 *)(rcm + 0x30);
    lVar13 = iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    pvVar1 = (void *)(lVar13 + lVar7 * 8);
    uVar9 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1);
    if (((ulong)pvVar1 & 7) != 0) {
      uVar9 = 6;
    }
    iVar15 = (int)uVar9;
    if (uVar9 != 0) {
      memcpy(pvVar1,&local_f8,(ulong)(uint)(iVar15 * 8));
    }
    uVar6 = (6U - iVar15 & 0xfffffffe) + uVar9;
    if (((ulong)pvVar1 & 7) == 0) {
      uVar8 = uVar9 + 2;
      if (uVar9 + 2 < uVar6) {
        uVar8 = uVar6;
      }
      memcpy((void *)(lVar13 + (uVar9 + lVar7) * 8),&local_f8.super_SpatialForceVector + uVar9 * 8,
             (~uVar9 + uVar8 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if ((uint)uVar6 < 6) {
      uVar9 = (ulong)((iVar15 + (6U - iVar15 & 0xfffffffe)) * 8);
      memcpy((void *)(lVar13 + uVar9 + lVar7 * 8),&local_f8.super_SpatialForceVector + uVar9,
             0x30 - (ulong)((uint)uVar6 << 3));
    }
  }
  return (bool)uVar5;
}

Assistant:

bool BerdyHelper::serializeSensorVariables(SensorsMeasurements& sensMeas,
                                           LinkNetExternalWrenches& netExtWrenches,
                                           JointDOFsDoubleArray& jointTorques,
                                           JointDOFsDoubleArray& jointAccs,
                                           LinkInternalWrenches& linkJointWrenches,
                                           SpatialForceVector& rcm,
                                           VectorDynSize& y)
{
    bool ret=true;
    assert(y.size() == this->getNrOfSensorsMeasurements());

    bool ok = sensMeas.toVector(realSensorMeas);
    ret = ret && ok;

    // The first part of the sensor vector is exactly the serialization of the sensMeas object
    IndexRange ran;
    ran.offset = 0;
    ran.size = realSensorMeas.size();
    setSubVector(y,ran,toEigen(realSensorMeas));

    // Then we need to follow the serialization used in computeBerdySensorMatrices

     ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);

            setSubVector(y,sensorRange,jointAccs(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);

            setSubVector(y,sensorRange,jointTorques(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            if( !(m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                  m_dynamicsTraversal.getBaseLink()->getIndex() == idx) ||
                 m_options.includeFixedBaseExternalWrench  )
            {
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);

                setSubVector(y,sensorRange,toEigen(m_link_H_externalWrenchMeasurementFrame[idx].inverse()*netExtWrenches(idx)));
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);

        LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,berdySensorsInfo.wrenchSensors[i]);
        setSubVector(y,sensorRange,toEigen(linkJointWrenches(childLink)));
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM)
    ////////////////////////////////////////////////////////////////////////
    /// This method serializeSensorVariables is used in Testing for the Berdy estimator helper class
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        IndexRange sensorRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        setSubVector(y, sensorRange, rcm);
    }

    return ret;
}